

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

SimpleString __thiscall
JUnitTestOutput::encodeFileName(JUnitTestOutput *this,SimpleString *fileName)

{
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t sVar1;
  size_t extraout_RDX_00;
  long lVar2;
  SimpleString SVar3;
  
  SimpleString::SimpleString((SimpleString *)this,in_RDX);
  sVar1 = extraout_RDX;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    SimpleString::replace((SimpleString *)this,"/\\?%*:|\"<>"[lVar2],'_');
    sVar1 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar1;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString JUnitTestOutput::encodeFileName(const SimpleString& fileName)
{
    // special character list based on: https://en.wikipedia.org/wiki/Filename
    static const char* const forbiddenCharacters = "/\\?%*:|\"<>";

    SimpleString result = fileName;
    for (const char* sym = forbiddenCharacters; *sym; ++sym) {
        result.replace(*sym, '_');
    }
    return result;
}